

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat * __thiscall Mat::col(Mat *__return_storage_ptr__,Mat *this,int st,int ed)

{
  pointer p_Var1;
  
  Mat(__return_storage_ptr__,this->r,((ed - st) + this->c) % this->c);
  p_Var1 = (this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<__int128,std::allocator<__int128>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<__int128_const*,std::vector<__int128,std::allocator<__int128>>>>
            ((vector<__int128,std::allocator<__int128>> *)&__return_storage_ptr__->val,
             p_Var1 + st * this->r,p_Var1 + this->r * ed);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::col(int st, int ed) const {
    Mat ret(r, (ed - st + c) % c);
    ret.val.assign(val.begin() + st * r, val.begin() + ed * r);
    return ret;
}